

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

any * __thiscall
Omega_h::ExprOpsReader::at_reduce
          (any *__return_storage_ptr__,ExprOpsReader *this,int prod,
          vector<Omega_h::any,_std::allocator<Omega_h::any>_> *rhs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  size_type sVar2;
  any *rhs_00;
  CallOp *this_00;
  MulOp *this_01;
  SubOp *this_02;
  OrOp *this_03;
  LtOp *this_04;
  AndOp *this_05;
  SemicolonOp *pSVar3;
  GtOp *this_06;
  TernaryOp *this_07;
  NegOp *this_08;
  AddOp *this_09;
  AssignOp *this_10;
  DivOp *this_11;
  vector<Omega_h::any,_std::allocator<Omega_h::any>_> *pvVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  VarOp *this_12;
  PowOp *this_13;
  EqOp *this_14;
  ParserFail *pPVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  shared_ptr<Omega_h::ExprOp> op_lhs;
  ScopedTimer omega_h_scoped_function_timer;
  shared_ptr<Omega_h::ExprOp> op_rhs;
  OpPtr rhs_op_6;
  allocator local_229;
  string local_228;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_200;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__cxx11::string::string
            ((string *)&rhs_op_6,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
             ,&local_229);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op_rhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rhs_op_6,":")
  ;
  std::__cxx11::to_string(&local_228,0x406);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op_lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&op_rhs,
                 &local_228);
  begin_code("at_reduce",
             (char *)op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&op_lhs);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&op_rhs);
  std::__cxx11::string::~string((string *)&rhs_op_6);
  switch(prod) {
  case 0:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    if (pvVar5->vtable == (vtable_type *)0x0) {
      pPVar7 = (ParserFail *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&op_lhs,"Omega_h::ExprReader needs an expression to evaluate!",
                 (allocator *)&op_rhs);
      ParserFail::ParserFail(pPVar7,(string *)&op_lhs);
      __cxa_throw(pPVar7,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    if (pvVar5->vtable == (vtable_type *)0x0) {
      rhs_00 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
      goto LAB_00283a5c;
    }
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    pSVar3 = (SemicolonOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    SemicolonOp::SemicolonOp(pSVar3,(OpPtr *)&local_40,(OpPtr *)&local_50);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Omega_h::SemicolonOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,pSVar3);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    p_Var8 = &local_40._M_refcount;
    break;
  default:
    __return_storage_ptr__->vtable = (vtable_type *)0x0;
    goto LAB_002846ee;
  case 2:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    if (pvVar5->vtable == (vtable_type *)0x0) {
      rhs_00 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
      goto LAB_00283a5c;
    }
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    pSVar3 = (SemicolonOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    SemicolonOp::SemicolonOp(pSVar3,(OpPtr *)&local_60,(OpPtr *)&local_70);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Omega_h::SemicolonOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,pSVar3);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    p_Var8 = &local_60._M_refcount;
    break;
  case 3:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar6 = any_cast<std::__cxx11::string&>(pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,4);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    this_10 = (AssignOp *)operator_new(0x38);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    AssignOp::AssignOp(this_10,pbVar6,(OpPtr *)&local_80);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Omega_h::AssignOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&op_rhs,this_10);
    _Var1 = op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    p_Var8 = &local_80._M_refcount;
    goto LAB_002846df;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x1e:
  case 0x23:
    rhs_00 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    goto LAB_00283a5c;
  case 0xe:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,6);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&rhs_op_6,pvVar5);
    this_07 = (TernaryOp *)operator_new(0x38);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b0,&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    TernaryOp::TernaryOp(this_07,(OpPtr *)&local_90,(OpPtr *)&local_a0,(OpPtr *)&local_b0);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Omega_h::TernaryOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&local_228,this_07);
    sVar2 = local_228._M_string_length;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    local_228._M_string_length = 0;
    (__return_storage_ptr__->storage).dynamic = local_228._M_dataplus._M_p;
    *(size_type *)((long)&__return_storage_ptr__->storage + 8) = sVar2;
    local_228._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    p_Var8 = &rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    break;
  case 0xf:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_03 = (OrOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    OrOp::OrOp(this_03,(OpPtr *)&local_c0,(OpPtr *)&local_d0);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::OrOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_03);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    p_Var8 = &local_c0._M_refcount;
    break;
  case 0x10:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_05 = (AndOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_e0,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_f0,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    AndOp::AndOp(this_05,(OpPtr *)&local_e0,(OpPtr *)&local_f0);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::AndOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_05);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
    p_Var8 = &local_e0._M_refcount;
    break;
  case 0x11:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_06 = (GtOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_100,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_110,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    GtOp::GtOp(this_06,(OpPtr *)&local_100,(OpPtr *)&local_110);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::GtOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_06);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
    p_Var8 = &local_100._M_refcount;
    break;
  case 0x12:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_04 = (LtOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_120,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_130,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    LtOp::LtOp(this_04,(OpPtr *)&local_120,(OpPtr *)&local_130);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::LtOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_04);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
    p_Var8 = &local_120._M_refcount;
    break;
  case 0x13:
  case 0x14:
    pPVar7 = (ParserFail *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&op_lhs,"Operators <= and >= not supported yet",(allocator *)&op_rhs);
    ParserFail::ParserFail(pPVar7,(string *)&op_lhs);
    __cxa_throw(pPVar7,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
  case 0x15:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_14 = (EqOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_140,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_150,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    EqOp::EqOp(this_14,(OpPtr *)&local_140,(OpPtr *)&local_150);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::EqOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_14);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
    p_Var8 = &local_140._M_refcount;
    break;
  case 0x16:
  case 0x22:
    rhs_00 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
LAB_00283a5c:
    any::any(__return_storage_ptr__,rhs_00);
    goto LAB_002846ee;
  case 0x17:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_09 = (AddOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_160,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_170,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    AddOp::AddOp(this_09,(OpPtr *)&local_160,(OpPtr *)&local_170);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::AddOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_09);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
    p_Var8 = &local_160._M_refcount;
    break;
  case 0x18:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_02 = (SubOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_180,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_190,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    SubOp::SubOp(this_02,(OpPtr *)&local_180,(OpPtr *)&local_190);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::SubOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_02);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
    p_Var8 = &local_180._M_refcount;
    break;
  case 0x19:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_01 = (MulOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1a0,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b0,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    MulOp::MulOp(this_01,(OpPtr *)&local_1a0,(OpPtr *)&local_1b0);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::MulOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_01);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
    p_Var8 = &local_1a0._M_refcount;
    break;
  case 0x1a:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_11 = (DivOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1c0,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1d0,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    DivOp::DivOp(this_11,(OpPtr *)&local_1c0,(OpPtr *)&local_1d0);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::DivOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_11);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
    p_Var8 = &local_1c0._M_refcount;
    break;
  case 0x1b:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_rhs,pvVar5);
    this_13 = (PowOp *)operator_new(0x28);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1e0,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1f0,&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    PowOp::PowOp(this_13,(OpPtr *)&local_1e0,(OpPtr *)&local_1f0);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::PowOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&rhs_op_6,this_13);
    _Var1 = rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs_op_6.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0._M_refcount);
    p_Var8 = &local_1e0._M_refcount;
    break;
  case 0x1c:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar6 = any_cast<std::__cxx11::string&>(pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,4);
    pvVar4 = any_cast<std::vector<Omega_h::any,std::allocator<Omega_h::any>>&>(pvVar5);
    this_00 = (CallOp *)operator_new(0x58);
    CallOp::CallOp(this_00,pbVar6,pvVar4);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Omega_h::CallOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&op_lhs,this_00);
    goto LAB_00284541;
  case 0x1d:
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    any::construct<std::vector<Omega_h::any,std::allocator<Omega_h::any>>>
              (__return_storage_ptr__,(vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)&op_lhs
              );
    goto LAB_00283c93;
  case 0x1f:
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::emplace_back<Omega_h::any>
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)&op_lhs,pvVar5);
    any::construct<std::vector<Omega_h::any,std::allocator<Omega_h::any>>>
              (__return_storage_ptr__,(vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)&op_lhs
              );
LAB_00283c93:
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::~vector
              ((vector<Omega_h::any,_std::allocator<Omega_h::any>_> *)&op_lhs);
    goto LAB_002846ee;
  case 0x20:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pvVar4 = any_cast<std::vector<Omega_h::any,std::allocator<Omega_h::any>>&>(pvVar5);
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,3);
    std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::emplace_back<Omega_h::any>
              (pvVar4,pvVar5);
    any::construct<std::vector<Omega_h::any,std::allocator<Omega_h::any>>>
              (__return_storage_ptr__,pvVar4);
    goto LAB_002846ee;
  case 0x21:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    any_cast<std::shared_ptr<Omega_h::ExprOp>>((Omega_h *)&op_lhs,pvVar5);
    this_08 = (NegOp *)operator_new(0x18);
    std::__shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_200,&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>);
    NegOp::NegOp(this_08,(OpPtr *)&local_200);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::NegOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&op_rhs,this_08);
    _Var1 = op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    p_Var8 = &local_200._M_refcount;
    goto LAB_002846df;
  case 0x24:
    pvVar5 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar6 = any_cast<std::__cxx11::string&>(pvVar5);
    this_12 = (VarOp *)operator_new(0x28);
    VarOp::VarOp(this_12,pbVar6);
    std::__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::VarOp,void>
              ((__shared_ptr<Omega_h::ExprOp,(__gnu_cxx::_Lock_policy)2> *)&op_lhs,this_12);
LAB_00284541:
    _Var1._M_pi = op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::shared_ptr<Omega_h::ExprOp>>()::table;
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->storage).dynamic =
         op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__return_storage_ptr__->storage + 8) =
         _Var1._M_pi;
    op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    goto LAB_002846e9;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var8);
  p_Var8 = &op_rhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
LAB_002846df:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var8);
LAB_002846e9:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&op_lhs.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_002846ee:
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return __return_storage_ptr__;
}

Assistant:

any ExprOpsReader::at_reduce(int prod, std::vector<any>& rhs) {
  OMEGA_H_TIME_FUNCTION;
  using std::swap;
  switch (prod) {
    case math_lang::PROD_PROGRAM: {
      if (rhs.at(1).empty()) {
        throw ParserFail(
            "Omega_h::ExprReader needs an expression to evaluate!");
      }
      if (rhs.at(0).empty()) {
        return any(std::move(rhs.at(1)));
      } else {
        auto op_lhs = any_cast<OpPtr>(rhs.at(0));
        auto op_rhs = any_cast<OpPtr>(rhs.at(1));
        return OpPtr(new SemicolonOp(op_lhs, op_rhs));
      }
    }
    case math_lang::PROD_NO_STATEMENTS:
    case math_lang::PROD_NO_EXPR: {
      return any();
    }
    case math_lang::PROD_NEXT_STATEMENT: {
      if (rhs.at(0).empty()) {
        return any(std::move(rhs.at(1)));
      } else {
        auto op_lhs = any_cast<OpPtr>(rhs.at(0));
        auto op_rhs = any_cast<OpPtr>(rhs.at(1));
        return OpPtr(new SemicolonOp(op_lhs, op_rhs));
      }
    }
    case math_lang::PROD_ASSIGN: {
      std::string const& name = any_cast<std::string&>(rhs.at(0));
      OpPtr rhs_op = any_cast<OpPtr>(rhs.at(4));
      return OpPtr(new AssignOp(name, rhs_op));
    }
    case math_lang::PROD_YES_EXPR:
    case math_lang::PROD_EXPR:
    case math_lang::PROD_TERNARY_DECAY:
    case math_lang::PROD_OR_DECAY:
    case math_lang::PROD_AND_DECAY:
    case math_lang::PROD_ADD_SUB_DECAY:
    case math_lang::PROD_MUL_DIV_DECAY:
    case math_lang::PROD_POW_DECAY:
    case math_lang::PROD_NEG_DECAY:
    case math_lang::PROD_SOME_ARGS:
    case math_lang::PROD_CONST:
      return any(std::move(rhs.at(0)));
    case math_lang::PROD_TERNARY: {
      OpPtr cond_op = any_cast<OpPtr>(rhs.at(0));
      OpPtr lhs_op = any_cast<OpPtr>(rhs.at(3));
      OpPtr rhs_op = any_cast<OpPtr>(rhs.at(6));
      return OpPtr(new TernaryOp(cond_op, lhs_op, rhs_op));
    }
    case math_lang::PROD_OR:
      OMEGA_H_BINARY_REDUCE(OrOp)
    case math_lang::PROD_AND:
      OMEGA_H_BINARY_REDUCE(AndOp)
    case math_lang::PROD_GT:
      OMEGA_H_BINARY_REDUCE(GtOp)
    case math_lang::PROD_LT:
      OMEGA_H_BINARY_REDUCE(LtOp)
    case math_lang::PROD_GEQ:
    case math_lang::PROD_LEQ:
      throw ParserFail("Operators <= and >= not supported yet");
    case math_lang::PROD_EQ:
      OMEGA_H_BINARY_REDUCE(EqOp)
    case math_lang::PROD_ADD:
      OMEGA_H_BINARY_REDUCE(AddOp)
    case math_lang::PROD_SUB:
      OMEGA_H_BINARY_REDUCE(SubOp)
    case math_lang::PROD_MUL:
      OMEGA_H_BINARY_REDUCE(MulOp)
    case math_lang::PROD_DIV:
      OMEGA_H_BINARY_REDUCE(DivOp)
    case math_lang::PROD_POW:
      OMEGA_H_BINARY_REDUCE(PowOp)
    case math_lang::PROD_CALL: {
      auto& name = any_cast<std::string&>(rhs.at(0));
      auto& args = any_cast<ExprEnv::Args&>(rhs.at(4));
      return OpPtr(new CallOp(name, args));
    }
    case math_lang::PROD_NO_ARGS:
      return ExprEnv::Args{};
    case math_lang::PROD_FIRST_ARG: {
      ExprEnv::Args args;
      args.push_back(std::move(rhs.at(0)));
      return any(std::move(args));
    }
    case math_lang::PROD_NEXT_ARG: {
      auto& args = any_cast<ExprEnv::Args&>(rhs.at(0));
      args.push_back(std::move(rhs.at(3)));
      return any(std::move(args));
    }
    case math_lang::PROD_NEG: {
      OpPtr rhs_op = any_cast<OpPtr>(rhs.at(2));
      return OpPtr(new NegOp(rhs_op));
    }
    case math_lang::PROD_VAL_PARENS:
    case math_lang::PROD_BOOL_PARENS:
      return any(std::move(rhs.at(2)));
    case math_lang::PROD_VAR: {
      auto& name = any_cast<std::string&>(rhs.at(0));
      return OpPtr(new VarOp(name));
    }
  }
  return any();
}